

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericmodel.cpp
# Opt level: O2

bool __thiscall
GenericModel::moveColumns
          (GenericModel *this,QModelIndex *sourceParent,int sourceColumn,int count,
          QModelIndex *destinationParent,int destinationChild)

{
  GenericModelPrivate *this_00;
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  
  iVar3 = (**(code **)(*(long *)this + 0x80))();
  if ((-1 < (destinationChild | sourceColumn)) && (count + sourceColumn <= iVar3)) {
    bVar1 = QModelIndex::operator!=(sourceParent,destinationParent);
    if (bVar1) {
      iVar3 = (**(code **)(*(long *)this + 0x80))(this,destinationParent);
      if (iVar3 < destinationChild) {
        return false;
      }
      iVar3 = (**(code **)(*(long *)this + 0x78))(this,sourceParent);
      iVar4 = (**(code **)(*(long *)this + 0x78))(this,destinationParent);
      if (iVar3 - iVar4 != 0 && iVar4 <= iVar3) {
        (**(code **)(*(long *)this + 0xf8))(this,iVar4,iVar3 - iVar4,destinationParent);
      }
    }
    else if (iVar3 < destinationChild) {
      return false;
    }
    cVar2 = QAbstractItemModel::beginMoveColumns
                      ((QModelIndex *)this,(int)sourceParent,sourceColumn,
                       (QModelIndex *)(ulong)((count + sourceColumn) - 1),(int)destinationParent);
    if (cVar2 != '\0') {
      this_00 = this->m_dptr;
      bVar1 = QModelIndex::operator!=(sourceParent,destinationParent);
      if (bVar1) {
        GenericModelPrivate::moveColumnsDifferentParent
                  (this_00,sourceParent,sourceColumn,count,destinationParent,destinationChild);
      }
      else {
        GenericModelPrivate::moveColumnsSameParent
                  (this_00,sourceParent,sourceColumn,count,destinationChild);
      }
      QAbstractItemModel::endMoveColumns();
      return true;
    }
  }
  return false;
}

Assistant:

bool GenericModel::moveColumns(const QModelIndex &sourceParent, int sourceColumn, int count, const QModelIndex &destinationParent,
                               int destinationChild)
{
    Q_ASSERT(!sourceParent.isValid() || sourceParent.model() == this);
    Q_ASSERT(!destinationParent.isValid() || destinationParent.model() == this);
    const int colCnt = columnCount(sourceParent);
    if (destinationChild < 0 || sourceColumn < 0 || sourceColumn + count - 1 >= colCnt)
        return false;
    if (sourceParent != destinationParent) {
        if (destinationChild > columnCount(destinationParent))
            return false;
        const int sourceRowCount = rowCount(sourceParent);
        const int destRowCount = rowCount(destinationParent);
        if (sourceRowCount > destRowCount)
            insertRows(destRowCount, sourceRowCount - destRowCount, destinationParent);
    } else if (destinationChild > colCnt)
        return false;
    if (!beginMoveColumns(sourceParent, sourceColumn, sourceColumn + count - 1, destinationParent, destinationChild))
        return false;
    Q_D(GenericModel);
    if (sourceParent != destinationParent)
        d->moveColumnsDifferentParent(sourceParent, sourceColumn, count, destinationParent, destinationChild);
    else
        d->moveColumnsSameParent(sourceParent, sourceColumn, count, destinationChild);
    endMoveColumns();
    return true;
}